

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O0

void __thiscall
wabt::(anonymous_namespace)::CWriter::
Write<char_const(&)[6],char_const(&)[22],std::__cxx11::string&,char_const(&)[6],wabt::(anonymous_namespace)::Newline>
          (CWriter *this,char (*t) [6],char (*u) [22],
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args,char (*args_1) [6]
          ,Newline *args_2)

{
  string_view local_58;
  string_view local_48;
  Newline *local_38;
  Newline *args_local_2;
  char (*args_local_1) [6];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_local;
  char (*u_local) [22];
  char (*t_local) [6];
  CWriter *this_local;
  
  local_38 = args_2;
  args_local_2 = (Newline *)args_1;
  args_local_1 = (char (*) [6])args;
  args_local = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)u;
  u_local = (char (*) [22])t;
  t_local = (char (*) [6])this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_48,*t);
  anon_unknown_0::CWriter::Write((CWriter *)this,local_48);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_58,(char *)args_local);
  anon_unknown_0::CWriter::Write((CWriter *)this,local_58);
  Write<std::__cxx11::string&,char_const(&)[6],wabt::(anonymous_namespace)::Newline>
            (this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_local_1,
             (char (*) [6])args_local_2,local_38);
  return;
}

Assistant:

void Write(T&& t, U&& u, Args&&... args) {
    Write(std::forward<T>(t));
    Write(std::forward<U>(u));
    Write(std::forward<Args>(args)...);
  }